

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

int __thiscall glcts::CubeMapArrayDataStorage::init(CubeMapArrayDataStorage *this,EVP_PKEY_CTX *ctx)

{
  GLuint GVar1;
  GLubyte *pGVar2;
  void *pvVar3;
  GLuint in_ECX;
  GLuint in_EDX;
  byte in_R8B;
  GLubyte initial_value_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  CubeMapArrayDataStorage *this_local;
  
  deinit(this);
  this->m_width = (GLuint)ctx;
  this->m_height = in_EDX;
  this->m_depth = in_ECX;
  GVar1 = getArraySize(this);
  pGVar2 = (GLubyte *)operator_new__((ulong)GVar1);
  this->m_data_array = pGVar2;
  pGVar2 = this->m_data_array;
  GVar1 = getArraySize(this);
  pvVar3 = memset(pGVar2,(uint)in_R8B,(ulong)GVar1);
  return (int)pvVar3;
}

Assistant:

void CubeMapArrayDataStorage::init(const glw::GLuint width, const glw::GLuint height, const glw::GLuint depth,
								   glw::GLubyte initial_value)
{
	deinit();

	m_width  = width;
	m_height = height;
	m_depth  = depth;

	m_data_array = new glw::GLubyte[getArraySize()];

	memset(m_data_array, initial_value, getArraySize() * sizeof(glw::GLubyte));
}